

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O0

void __thiscall mserialize::cx_string<12UL>::cx_string(cx_string<12UL> *this,char *str)

{
  char *local_20;
  size_t i;
  char *str_local;
  cx_string<12UL> *this_local;
  
  this->_data[0] = '\0';
  local_20 = this->_data + 1;
  do {
    *local_20 = '\0';
    local_20 = local_20 + 1;
  } while ((cx_string<12UL> *)local_20 != this + 1);
  for (i = 0; i < 0xc; i = i + 1) {
    this->_data[i] = str[i];
  }
  return;
}

Assistant:

explicit constexpr cx_string(const char* str)
    :_data{0}
  {
    #if defined(__GNUC__) && !defined(__clang__)
      // https://gcc.gnu.org/bugzilla/show_bug.cgi?id=96742
      #pragma GCC diagnostic push
      #pragma GCC diagnostic ignored "-Wtype-limits"
    #endif
    for (std::size_t i = 0; i < N; ++i)
    {
      _data[i] = str[i];
    }
    #if defined(__GNUC__) && !defined(__clang__)
      #pragma GCC diagnostic pop
    #endif
  }